

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetCommand.cxx
# Opt level: O2

bool __thiscall
cmSetCommand::InitialPass
          (cmSetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  CacheEntryType CVar5;
  ulong uVar6;
  cmState *this_01;
  char *pcVar7;
  pointer pbVar8;
  long lVar9;
  uint uVar10;
  pointer pbVar11;
  undefined1 force;
  uint uVar12;
  pointer doc;
  string putEnvArg;
  string value;
  string currValue;
  CacheEntryType type;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  str1 = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if (str1 == (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"called with incorrect number of arguments",
               (allocator<char> *)&putEnvArg);
    cmCommand::SetError(&this->super_cmCommand,&value);
    std::__cxx11::string::~string((string *)&value);
    return false;
  }
  bVar2 = cmHasLiteralPrefix<std::__cxx11::string,5ul>(str1,(char (*) [5])"ENV{");
  if ((bVar2) && (5 < str1->_M_string_length)) {
    std::__cxx11::string::substr((ulong)&value,(ulong)str1);
    std::operator+(&putEnvArg,&value,"=");
    currValue._M_dataplus._M_p = (pointer)&currValue.field_2;
    currValue._M_string_length = 0;
    currValue.field_2._M_local_buf[0] = '\0';
    bVar2 = cmsys::SystemTools::GetEnv(&value,&currValue);
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x21) ||
       (pbVar8[1]._M_string_length == 0)) {
      if (bVar2) {
        cmsys::SystemTools::PutEnv(&putEnvArg);
      }
    }
    else {
      if ((!bVar2) || (bVar2 = std::operator!=(&currValue,pbVar8 + 1), bVar2)) {
        std::__cxx11::string::append((string *)&putEnvArg);
        cmsys::SystemTools::PutEnv(&putEnvArg);
      }
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0x40 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
        std::operator+(&local_50,
                       "Only the first value argument is used when setting an environment variable.  Argument \'"
                       ,pbVar8 + 2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                       &local_50,"\' and later are unused.");
        std::__cxx11::string::~string((string *)&local_50);
        cmMakefile::IssueMessage((this->super_cmCommand).Makefile,AUTHOR_WARNING,(string *)&type);
        std::__cxx11::string::~string((string *)&type);
      }
    }
    std::__cxx11::string::~string((string *)&currValue);
    std::__cxx11::string::~string((string *)&putEnvArg);
    std::__cxx11::string::~string((string *)&value);
    return true;
  }
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)pbVar11 - (long)pbVar8;
  if ((long)uVar6 >> 5 == 2) {
    bVar2 = std::operator==(pbVar11 + -1,"PARENT_SCOPE");
    if (bVar2) {
      cmMakefile::RaiseScope((this->super_cmCommand).Makefile,str1,(char *)0x0);
      return true;
    }
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (long)pbVar11 - (long)pbVar8;
  }
  else if ((long)uVar6 >> 5 == 1) {
    cmMakefile::RemoveDefinition((this->super_cmCommand).Makefile,str1);
    return true;
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  type = STRING;
  if (uVar6 < 0x21) {
LAB_001d06f1:
    bVar3 = false;
    uVar12 = 0;
LAB_001d06f4:
    if ((ulong)((long)uVar6 >> 5) < 4) {
      bVar4 = false;
      bVar2 = false;
    }
    else {
      bVar4 = std::operator==(pbVar8 + (((long)uVar6 >> 5) - (ulong)bVar3) + -3,"CACHE");
      uVar10 = uVar12 + 3;
      if (!bVar4) {
        uVar10 = uVar12;
      }
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      bVar2 = false;
      uVar12 = uVar10;
    }
  }
  else {
    bVar2 = std::operator==(pbVar11 + -1,"PARENT_SCOPE");
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = false;
    if (!bVar2) {
      uVar6 = (long)pbVar11 - (long)pbVar8;
      if (uVar6 < 0x81) goto LAB_001d06f1;
      bVar3 = std::operator==(pbVar11 + -1,"FORCE");
      uVar12 = (uint)bVar3;
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = (long)pbVar11 - (long)pbVar8;
      goto LAB_001d06f4;
    }
    bVar2 = true;
    bVar4 = false;
    uVar12 = 1;
  }
  currValue._M_dataplus._M_p = (pointer)(pbVar8 + 1);
  currValue._M_string_length = (long)pbVar11 - (ulong)(uVar12 << 5);
  cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&putEnvArg,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&currValue,";");
  std::__cxx11::string::operator=((string *)&value,(string *)&putEnvArg);
  std::__cxx11::string::~string((string *)&putEnvArg);
  if (bVar2) {
    bVar2 = true;
    cmMakefile::RaiseScope((this->super_cmCommand).Makefile,str1,value._M_dataplus._M_p);
  }
  else {
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish + -1,"CACHE");
    if (!bVar2) {
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
      if (((uVar6 < 0x21) ||
          (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)pbVar8 + (uVar6 - 0x40)),"CACHE"), !bVar2)) &&
         (bVar3 != true || bVar4 != false)) {
        if (bVar4 == false) {
          doc = (char *)0x0;
          force = bVar3;
        }
        else {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar9 = ((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) -
                  (ulong)bVar3;
          lVar1 = lVar9 + -2;
          local_58 = (ulong)bVar3;
          bVar2 = cmState::StringToCacheEntryType(pbVar8[lVar1]._M_dataplus._M_p,&type);
          if (!bVar2) {
            std::operator+(&currValue,"implicitly converting \'",
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar1);
            std::operator+(&putEnvArg,&currValue,"\' to \'STRING\' type.");
            std::__cxx11::string::~string((string *)&currValue);
            cmMakefile::IssueMessage((this->super_cmCommand).Makefile,AUTHOR_WARNING,&putEnvArg);
            type = STRING;
            std::__cxx11::string::~string((string *)&putEnvArg);
          }
          doc = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[lVar9 + -1]._M_dataplus._M_p;
          force = (char)local_58;
        }
        this_01 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        pcVar7 = cmState::GetCacheEntryValue(this_01,str1);
        if (((pcVar7 == (char *)0x0) ||
            (CVar5 = cmState::GetCacheEntryType(this_01,str1), CVar5 == UNINITIALIZED)) ||
           ((bVar4 == false || ((type == INTERNAL || (bVar2 = true, bVar3 != false)))))) {
          this_00 = (this->super_cmCommand).Makefile;
          if (bVar4 == false) {
            bVar2 = true;
            cmMakefile::AddDefinition(this_00,str1,value._M_dataplus._M_p);
          }
          else {
            bVar2 = true;
            cmMakefile::AddCacheDefinition(this_00,str1,value._M_dataplus._M_p,doc,type,(bool)force)
            ;
          }
        }
        goto LAB_001d08df;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&putEnvArg,"given invalid arguments for CACHE mode.",
               (allocator<char> *)&currValue);
    cmCommand::SetError(&this->super_cmCommand,&putEnvArg);
    std::__cxx11::string::~string((string *)&putEnvArg);
    bVar2 = false;
  }
LAB_001d08df:
  std::__cxx11::string::~string((string *)&value);
  return bVar2;
}

Assistant:

bool cmSetCommand::InitialPass(std::vector<std::string> const& args,
                               cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // watch for ENV signatures
  auto const& variable = args[0]; // VAR is always first
  if (cmHasLiteralPrefix(variable, "ENV{") && variable.size() > 5) {
    // what is the variable name
    auto const& varName = variable.substr(4, variable.size() - 5);
    std::string putEnvArg = varName + "=";

    // what is the current value if any
    std::string currValue;
    const bool currValueSet = cmSystemTools::GetEnv(varName, currValue);

    // will it be set to something, then set it
    if (args.size() > 1 && !args[1].empty()) {
      // but only if it is different from current value
      if (!currValueSet || currValue != args[1]) {
        putEnvArg += args[1];
        cmSystemTools::PutEnv(putEnvArg);
      }
      // if there's extra arguments, warn user
      // that they are ignored by this command.
      if (args.size() > 2) {
        std::string m = "Only the first value argument is used when setting "
                        "an environment variable.  Argument '" +
          args[2] + "' and later are unused.";
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, m);
      }
      return true;
    }

    // if it will be cleared, then clear it if it isn't already clear
    if (currValueSet) {
      cmSystemTools::PutEnv(putEnvArg);
    }
    return true;
  }

  // SET (VAR) // Removes the definition of VAR.
  if (args.size() == 1) {
    this->Makefile->RemoveDefinition(variable);
    return true;
  }
  // SET (VAR PARENT_SCOPE) // Removes the definition of VAR
  // in the parent scope.
  if (args.size() == 2 && args.back() == "PARENT_SCOPE") {
    this->Makefile->RaiseScope(variable, nullptr);
    return true;
  }

  // here are the remaining options
  //  SET (VAR value )
  //  SET (VAR value PARENT_SCOPE)
  //  SET (VAR CACHE TYPE "doc String" [FORCE])
  //  SET (VAR value CACHE TYPE "doc string" [FORCE])
  std::string value;  // optional
  bool cache = false; // optional
  bool force = false; // optional
  bool parentScope = false;
  cmStateEnums::CacheEntryType type =
    cmStateEnums::STRING;          // required if cache
  const char* docstring = nullptr; // required if cache

  unsigned int ignoreLastArgs = 0;
  // look for PARENT_SCOPE argument
  if (args.size() > 1 && args.back() == "PARENT_SCOPE") {
    parentScope = true;
    ignoreLastArgs++;
  } else {
    // look for FORCE argument
    if (args.size() > 4 && args.back() == "FORCE") {
      force = true;
      ignoreLastArgs++;
    }

    // check for cache signature
    if (args.size() > 3 &&
        args[args.size() - 3 - (force ? 1 : 0)] == "CACHE") {
      cache = true;
      ignoreLastArgs += 3;
    }
  }

  // collect any values into a single semi-colon separated value list
  value = cmJoin(cmMakeRange(args).advance(1).retreat(ignoreLastArgs), ";");

  if (parentScope) {
    this->Makefile->RaiseScope(variable, value.c_str());
    return true;
  }

  // we should be nice and try to catch some simple screwups if the last or
  // next to last args are CACHE then they screwed up.  If they used FORCE
  // without CACHE they screwed up
  if ((args.back() == "CACHE") ||
      (args.size() > 1 && args[args.size() - 2] == "CACHE") ||
      (force && !cache)) {
    this->SetError("given invalid arguments for CACHE mode.");
    return false;
  }

  if (cache) {
    std::string::size_type cacheStart = args.size() - 3 - (force ? 1 : 0);
    if (!cmState::StringToCacheEntryType(args[cacheStart + 1].c_str(), type)) {
      std::string m = "implicitly converting '" + args[cacheStart + 1] +
        "' to 'STRING' type.";
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, m);
      // Setting this may not be required, since it's
      // initialized as a string. Keeping this here to
      // ensure that the type is actually converting to a string.
      type = cmStateEnums::STRING;
    }
    docstring = args[cacheStart + 2].c_str();
  }

  // see if this is already in the cache
  cmState* state = this->Makefile->GetState();
  const char* existingValue = state->GetCacheEntryValue(variable);
  if (existingValue &&
      (state->GetCacheEntryType(variable) != cmStateEnums::UNINITIALIZED)) {
    // if the set is trying to CACHE the value but the value
    // is already in the cache and the type is not internal
    // then leave now without setting any definitions in the cache
    // or the makefile
    if (cache && type != cmStateEnums::INTERNAL && !force) {
      return true;
    }
  }

  // if it is meant to be in the cache then define it in the cache
  if (cache) {
    this->Makefile->AddCacheDefinition(variable, value.c_str(), docstring,
                                       type, force);
  } else {
    // add the definition
    this->Makefile->AddDefinition(variable, value.c_str());
  }
  return true;
}